

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void http_rd_start(nni_http_conn *conn)

{
  size_t *psVar1;
  ulong uVar2;
  nng_err result;
  nni_aio *aio;
  nni_http_chunks *cl;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  nni_iov *iov_00;
  nng_http_status status;
  uint nio_00;
  ulong n;
  nni_list *list;
  uint8_t *puVar6;
  undefined1 local_68 [8];
  nni_iov iov1;
  nni_iov *local_50;
  nni_iov *iov;
  uint local_3c;
  ulong uStack_38;
  uint nio;
  
  list = &conn->rdq;
  psVar1 = &conn->rd_get;
  iov = (nni_iov *)list;
  do {
    result = NNG_ECLOSED;
    aio = conn->rd_uaio;
    if (aio == (nni_aio *)0x0) {
      aio = (nni_aio *)nni_list_first(list);
      if (aio == (nni_aio *)0x0) {
        return;
      }
      nni_list_remove(list,aio);
      conn->rd_uaio = aio;
    }
    if (conn->closed != false) goto LAB_001310be;
    result = NNG_EINVAL;
    if (HTTP_RD_DISCARD < conn->rd_flavor) goto LAB_001310be;
    sVar3 = conn->rd_get;
    n = conn->rd_put - sVar3;
    puVar6 = conn->buf + sVar3;
    switch(conn->rd_flavor) {
    case HTTP_RD_RAW:
      iov1.iov_len._4_4_ = (undefined4)CONCAT71((int7)(sVar3 >> 8),1);
      goto LAB_00131271;
    case HTTP_RD_FULL:
      iov1.iov_len._4_4_ = 0;
LAB_00131271:
      nni_aio_get_iov(aio,&local_3c,&local_50);
      while ((local_3c != 0 && (n != 0))) {
        uStack_38 = local_50->iov_len;
        if (n <= local_50->iov_len) {
          uStack_38 = n;
        }
        memcpy(local_50->iov_buf,puVar6,uStack_38);
        local_50->iov_len = local_50->iov_len - uStack_38;
        local_50->iov_buf = (void *)((long)local_50->iov_buf + uStack_38);
        *psVar1 = *psVar1 + uStack_38;
        puVar6 = puVar6 + uStack_38;
        nni_aio_bump_count(aio,uStack_38);
        n = n - uStack_38;
        if (local_50->iov_len == 0) {
          local_3c = local_3c - 1;
          local_50 = local_50 + 1;
        }
      }
      nni_aio_set_iov(aio,local_3c,local_50);
      list = (nni_list *)iov;
      if ((local_3c == 0) ||
         ((iov1.iov_len._4_1_ != '\0' && (sVar3 = nni_aio_count(aio), sVar3 != 0))))
      goto LAB_00131357;
      conn->buffered = false;
      iov_00 = local_50;
      nio_00 = local_3c;
      goto LAB_00131467;
    case HTTP_RD_REQ:
      conn->client = true;
      result = nni_http_req_parse(conn,puVar6,n,&stack0xffffffffffffffc8);
      conn->client = false;
      sVar3 = conn->rd_get + uStack_38;
      conn->rd_get = sVar3;
      if (sVar3 == conn->rd_put) {
        *psVar1 = 0;
        conn->rd_put = 0;
      }
      if (result == NNG_EAGAIN) {
        http_buf_pull_up(conn);
        sVar5 = conn->bufsz;
        sVar4 = conn->rd_put;
        if (sVar4 == sVar5) {
          status = NNG_HTTP_STATUS_URI_TOO_LONG;
          if ((conn->req).data.parsed != false) {
            status = NNG_HTTP_STATUS_HEADERS_TOO_LARGE;
          }
          nng_http_set_status(conn,status,(char *)0x0);
          builtin_memcpy(conn->buf,"NNG-DISCARD: X",0xf);
          conn->rd_get = 0;
          puVar6 = conn->buf;
          sVar4 = strlen((char *)puVar6);
          conn->rd_put = sVar4;
          sVar5 = conn->bufsz;
        }
        else {
          puVar6 = conn->buf;
        }
        local_68 = (undefined1  [8])(puVar6 + sVar4);
        goto LAB_00131452;
      }
      break;
    case HTTP_RD_RES:
      conn->client = false;
      result = nni_http_res_parse(conn,puVar6,n,&stack0xffffffffffffffc8);
      list = (nni_list *)iov;
      conn->client = true;
      sVar3 = conn->rd_get + uStack_38;
      conn->rd_get = sVar3;
      if (sVar3 == conn->rd_put) {
        *psVar1 = 0;
        conn->rd_put = 0;
      }
      if (result == NNG_EAGAIN) {
        http_buf_pull_up(conn);
        local_68 = (undefined1  [8])(conn->buf + conn->rd_put);
        iov1.iov_buf = (void *)(conn->bufsz - conn->rd_put);
        conn->buffered = true;
        if (iov1.iov_buf == (void *)0x0) {
          result = NNG_EMSGSIZE;
          goto LAB_001310be;
        }
        iov_00 = (nni_iov *)local_68;
        nio_00 = 1;
        goto LAB_00131467;
      }
      break;
    case HTTP_RD_CHUNK:
      cl = (nni_http_chunks *)nni_aio_get_prov_data(aio);
      result = nni_http_chunks_parse(cl,puVar6,n,&stack0xffffffffffffffc8);
      sVar4 = conn->rd_put;
      sVar5 = conn->rd_get + uStack_38;
      conn->rd_get = sVar5;
      if (sVar5 == sVar4) {
        *psVar1 = 0;
        conn->rd_put = 0;
        sVar4 = 0;
      }
      if (result == NNG_EAGAIN) goto LAB_0013141a;
      break;
    case HTTP_RD_DISCARD:
      uVar2 = conn->rd_discard;
      uStack_38 = n;
      if (uVar2 <= n) {
        uStack_38 = uVar2;
      }
      conn->rd_get = sVar3 + uStack_38;
      conn->rd_discard = uVar2 - uStack_38;
      http_buf_pull_up(conn);
      list = (nni_list *)iov;
      if (conn->rd_discard == 0) goto LAB_00131357;
      sVar4 = conn->rd_put;
LAB_0013141a:
      local_68 = (undefined1  [8])(conn->buf + sVar4);
      sVar5 = conn->bufsz;
LAB_00131452:
      iov1.iov_buf = (void *)(sVar5 - sVar4);
      conn->buffered = true;
      iov_00 = (nni_iov *)local_68;
      nio_00 = 1;
LAB_00131467:
      nni_aio_set_iov(&conn->rd_aio,nio_00,iov_00);
      nng_stream_recv(conn->sock,&conn->rd_aio);
      return;
    }
    list = (nni_list *)iov;
    if (result == NNG_OK) {
LAB_00131357:
      conn->rd_uaio = (nni_aio *)0x0;
      sVar3 = nni_aio_count(aio);
      nni_aio_finish(aio,NNG_OK,sVar3);
    }
    else {
LAB_001310be:
      conn->rd_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(aio,result);
      http_close(conn);
    }
  } while( true );
}

Assistant:

static void
http_rd_start(nni_http_conn *conn)
{
	for (;;) {
		nni_aio *aio;
		int      rv;

		if ((aio = conn->rd_uaio) == NULL) {
			if ((aio = nni_list_first(&conn->rdq)) == NULL) {
				// No more stuff waiting for read.
				return;
			}
			nni_list_remove(&conn->rdq, aio);
			conn->rd_uaio = aio;
		}

		if (conn->closed) {
			rv = NNG_ECLOSED;
		} else {
			rv = http_rd_buf(conn, aio);
		}
		switch (rv) {
		case NNG_EAGAIN:
			return;
		case 0:
			conn->rd_uaio = NULL;
			nni_aio_finish(aio, NNG_OK, nni_aio_count(aio));
			break;
		default:
			conn->rd_uaio = NULL;
			nni_aio_finish_error(aio, rv);
			http_close(conn);
			break;
		}
	}
}